

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<const_QLatin1String_&,_const_QString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<const_QLatin1String_&,_const_QString_&> *this)

{
  long lVar1;
  long lVar2;
  char16_t *pcVar3;
  QAbstractConcatenable *this_00;
  QString *out;
  char16_t *__src;
  QLatin1StringView in;
  
  if ((this->a->m_data == (char *)0x0) && ((this->b->d).ptr == (char16_t *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    out = this->b;
    lVar1 = (out->d).size;
    lVar2 = this->a->m_size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + lVar2,Uninitialized);
    pcVar3 = (__return_storage_ptr__->d).ptr;
    this_00 = (QAbstractConcatenable *)this->a->m_size;
    in.m_data = (char *)pcVar3;
    in.m_size = (qsizetype)this->a->m_data;
    QAbstractConcatenable::appendLatin1To(this_00,in,(QChar *)out);
    lVar1 = (this->b->d).size;
    if (lVar1 != 0) {
      __src = (this->b->d).ptr;
      if (__src == (char16_t *)0x0) {
        __src = L"";
      }
      memcpy(pcVar3 + (long)this_00,__src,lVar1 * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }